

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_init(filemgr_config *config)

{
  bcache_config bVar1;
  filemgr_config *in_RDI;
  filemgr_config *unaff_retaddr;
  bcache_config bconfig;
  bcache_config *in_stack_00000050;
  int in_stack_00000058;
  int in_stack_0000005c;
  hash_cmp_func *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  int nbuckets;
  
  if (filemgr_initialized == '\0') {
    pthread_spin_lock(&initial_lock);
    if (filemgr_initialized == '\0') {
      memset(&sb_ops,0,0x40);
      filemgr_config::operator=(unaff_retaddr,in_RDI);
      nbuckets = (int)((ulong)in_RDI >> 0x20);
      bcache_config::bcache_config((bcache_config *)&stack0xfffffffffffffff7);
      bVar1.do_not_cache_doc_blocks = (bool)(global_config.do_not_cache_doc_blocks & 1);
      if (0 < global_config.ncacheblock) {
        bcache_init(in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      }
      hash_init((hash *)unaff_retaddr,nbuckets,
                (hash_hash_func *)CONCAT17(bVar1.do_not_cache_doc_blocks,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffe8);
      list_init(&temp_buf);
      pthread_spin_init(&temp_buf_lock,1);
      pthread_spin_init(&filemgr_openlock,1);
      filemgr_initialized = '\x01';
    }
    pthread_spin_unlock(&initial_lock);
  }
  return;
}

Assistant:

void filemgr_init(struct filemgr_config *config)
{
    // global initialization
    // initialized only once at first time
    if (!filemgr_initialized) {
#ifndef SPIN_INITIALIZER
        // Note that only Windows passes through this routine
        if (InterlockedCompareExchange(&initial_lock_status, 1, 0) == 0) {
            // atomically initialize spin lock only once
            spin_init(&initial_lock);
            initial_lock_status = 2;
        } else {
            // the others ... wait until initializing 'initial_lock' is done
            while (initial_lock_status != 2) {
                Sleep(1);
            }
        }
#endif

        spin_lock(&initial_lock);
        if (!filemgr_initialized) {
            memset(&sb_ops, 0x0, sizeof(sb_ops));
            global_config = *config;

            bcache_config bconfig;
            bconfig.do_not_cache_doc_blocks = global_config.do_not_cache_doc_blocks;
            if (global_config.ncacheblock > 0) {
                bcache_init(global_config.ncacheblock,
                            global_config.blocksize,
                            bconfig);
            }

            hash_init(&hash, NBUCKET, _file_hash, _file_cmp);

            // initialize temp buffer
            list_init(&temp_buf);
            spin_init(&temp_buf_lock);

            // initialize global lock
            spin_init(&filemgr_openlock);

            // set the initialize flag
            filemgr_initialized = 1;
        }
        spin_unlock(&initial_lock);
    }
}